

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void inputMethodInstantiateCallback(Display *display,XPointer clientData,XPointer callData)

{
  GLFWbool GVar1;
  _GLFWwindow *window;
  XIMCallback callback;
  _GLFWwindow *in_stack_00000088;
  _GLFWwindow *local_30;
  undefined8 local_28;
  code *local_20;
  
  if (_glfw.x11.im == (XIM)0x0) {
    _glfw.x11.im = (*_glfw.x11.xlib.OpenIM)
                             (_glfw.x11.display,(XrmDatabase *)0x0,(char *)0x0,(char *)0x0);
    if ((_glfw.x11.im != (XIM)0x0) && (GVar1 = hasUsableInputMethodStyle(), GVar1 == 0)) {
      (*_glfw.x11.xlib.CloseIM)(_glfw.x11.im);
      _glfw.x11.im = (XIM)0x0;
    }
    if (_glfw.x11.im != (XIM)0x0) {
      local_20 = inputMethodDestroyCallback;
      local_28 = 0;
      (*_glfw.x11.xlib.SetIMValues)(_glfw.x11.im,"destroyCallback",&local_28,0);
      for (local_30 = _glfw.windowListHead; local_30 != (_GLFWwindow *)0x0;
          local_30 = local_30->next) {
        _glfwCreateInputContextX11(in_stack_00000088);
      }
    }
  }
  return;
}

Assistant:

static void inputMethodInstantiateCallback(Display* display,
                                           XPointer clientData,
                                           XPointer callData)
{
    if (_glfw.x11.im)
        return;

    _glfw.x11.im = XOpenIM(_glfw.x11.display, 0, NULL, NULL);
    if (_glfw.x11.im)
    {
        if (!hasUsableInputMethodStyle())
        {
            XCloseIM(_glfw.x11.im);
            _glfw.x11.im = NULL;
        }
    }

    if (_glfw.x11.im)
    {
        XIMCallback callback;
        callback.callback = (XIMProc) inputMethodDestroyCallback;
        callback.client_data = NULL;
        XSetIMValues(_glfw.x11.im, XNDestroyCallback, &callback, NULL);

        for (_GLFWwindow* window = _glfw.windowListHead;  window;  window = window->next)
            _glfwCreateInputContextX11(window);
    }
}